

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

intptr_t fio_tcp_socket(char *address,char *port,uint8_t server)

{
  addrinfo **ppaVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  uint uVar5;
  bool bVar6;
  fio_data_s *pfVar7;
  int iVar8;
  uint __fd;
  uint uVar9;
  int *piVar10;
  long lVar11;
  addrinfo *paVar12;
  char *pcVar13;
  addrinfo *addrinfo;
  int optval;
  addrinfo *local_80;
  timespec local_78;
  addrinfo local_68;
  
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  iVar8 = getaddrinfo(address,port,&local_68,&local_80);
  if (iVar8 == 0) {
    __fd = socket(local_80->ai_family,local_80->ai_socktype,local_80->ai_protocol);
    if ((int)__fd < 1) {
      freeaddrinfo(local_80);
    }
    else {
      uVar9 = fcntl(__fd,3,0);
      uVar5 = uVar9 | 0x80800;
      if (uVar9 == 0xffffffff) {
        uVar5 = 0x80800;
      }
      iVar8 = fcntl(__fd,4,(ulong)uVar5);
      if (-1 < iVar8) {
        if (server == '\0') {
          local_78.tv_sec = CONCAT44(local_78.tv_sec._4_4_,1);
          setsockopt(__fd,6,1,&local_78,4);
          piVar10 = __errno_location();
          *piVar10 = 0;
          paVar12 = local_80;
          if (local_80 == (addrinfo *)0x0) {
            local_80 = (addrinfo *)0x0;
          }
          else {
            do {
              iVar8 = connect(__fd,paVar12->ai_addr,paVar12->ai_addrlen);
              if ((iVar8 == 0) || (*piVar10 == 0x73)) goto LAB_0012cbac;
              ppaVar1 = &paVar12->ai_next;
              paVar12 = *ppaVar1;
            } while (*ppaVar1 != (addrinfo *)0x0);
          }
        }
        else {
          local_78.tv_sec = CONCAT44(local_78.tv_sec._4_4_,1);
          setsockopt(__fd,1,2,&local_78,4);
          if (local_80 != (addrinfo *)0x0) {
            bVar6 = false;
            paVar12 = local_80;
            do {
              iVar8 = bind(__fd,paVar12->ai_addr,paVar12->ai_addrlen);
              if (iVar8 == 0) {
                bVar6 = true;
              }
              paVar12 = paVar12->ai_next;
            } while (paVar12 != (addrinfo *)0x0);
            if (bVar6) {
              local_78.tv_sec = CONCAT44(local_78.tv_sec._4_4_,0x80);
              setsockopt(__fd,local_80->ai_protocol,0x17,&local_78,4);
              iVar8 = listen(__fd,0x1000);
              if (-1 < iVar8) {
LAB_0012cbac:
                pfVar7 = fio_data;
                lVar11 = (ulong)__fd * 0xa8;
                LOCK();
                pcVar13 = (char *)((long)fio_data + lVar11 + 0x6c);
                cVar3 = *pcVar13;
                *pcVar13 = '\x01';
                UNLOCK();
                local_78.tv_sec._0_1_ = cVar3;
                if (cVar3 != '\0') {
                  pcVar13 = (char *)((long)pfVar7 + lVar11 + 0x6c);
                  do {
                    local_78.tv_sec = 0;
                    local_78.tv_nsec = 1;
                    nanosleep(&local_78,(timespec *)0x0);
                    LOCK();
                    cVar3 = *pcVar13;
                    *pcVar13 = '\x01';
                    UNLOCK();
                    local_78.tv_sec._0_1_ = cVar3;
                  } while (cVar3 != '\0');
                }
                fio_clear_fd((ulong)__fd,'\x01');
                LOCK();
                puVar2 = (undefined1 *)((long)fio_data + lVar11 + 0x6c);
                uVar4 = *puVar2;
                *puVar2 = 0;
                UNLOCK();
                local_78.tv_sec = CONCAT71(local_78.tv_sec._1_7_,uVar4);
                fio_tcp_addr_cpy(__fd,local_80->ai_family,(sockaddr *)local_80);
                freeaddrinfo(local_80);
                return (ulong)CONCAT41(__fd,*(undefined1 *)((long)fio_data + lVar11 + 0x6d));
              }
            }
          }
        }
      }
      freeaddrinfo(local_80);
      close(__fd);
    }
  }
  return -1;
}

Assistant:

static intptr_t fio_tcp_socket(const char *address, const char *port,
                               uint8_t server) {
  /* TCP/IP socket */
  // setup the address
  struct addrinfo hints = {0};
  struct addrinfo *addrinfo;       // will point to the results
  memset(&hints, 0, sizeof hints); // make sure the struct is empty
  hints.ai_family = AF_UNSPEC;     // don't care IPv4 or IPv6
  hints.ai_socktype = SOCK_STREAM; // TCP stream sockets
  hints.ai_flags = AI_PASSIVE;     // fill in my IP for me
  if (getaddrinfo(address, port, &hints, &addrinfo)) {
    // perror("addr err");
    return -1;
  }
  // get the file descriptor
  int fd =
      socket(addrinfo->ai_family, addrinfo->ai_socktype, addrinfo->ai_protocol);
  if (fd <= 0) {
    freeaddrinfo(addrinfo);
    return -1;
  }
  // make sure the socket is non-blocking
  if (fio_set_non_block(fd) < 0) {
    freeaddrinfo(addrinfo);
    close(fd);
    return -1;
  }
  if (server) {
    {
      // avoid the "address taken"
      int optval = 1;
      setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof(optval));
    }
    // bind the address to the socket
    int bound = 0;
    for (struct addrinfo *i = addrinfo; i != NULL; i = i->ai_next) {
      if (!bind(fd, i->ai_addr, i->ai_addrlen))
        bound = 1;
    }
    if (!bound) {
      // perror("bind err");
      freeaddrinfo(addrinfo);
      close(fd);
      return -1;
    }
#ifdef TCP_FASTOPEN
    {
      // support TCP Fast Open when available
      int optval = 128;
      setsockopt(fd, addrinfo->ai_protocol, TCP_FASTOPEN, &optval,
                 sizeof(optval));
    }
#endif
    if (listen(fd, SOMAXCONN) < 0) {
      freeaddrinfo(addrinfo);
      close(fd);
      return -1;
    }
  } else {
    int one = 1;
    setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &one, sizeof(one));
    errno = 0;
    for (struct addrinfo *i = addrinfo; i; i = i->ai_next) {
      if (connect(fd, i->ai_addr, i->ai_addrlen) == 0 || errno == EINPROGRESS)
        goto socket_okay;
    }
    freeaddrinfo(addrinfo);
    close(fd);
    return -1;
  }
socket_okay:
  fio_lock(&fd_data(fd).protocol_lock);
  fio_clear_fd(fd, 1);
  fio_unlock(&fd_data(fd).protocol_lock);
  fio_tcp_addr_cpy(fd, addrinfo->ai_family, (void *)addrinfo);
  freeaddrinfo(addrinfo);
  return fd2uuid(fd);
}